

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# board.cc
# Opt level: O1

void __thiscall board::Board::reset(Board *this)

{
  pointer pUVar1;
  long lVar2;
  
  lVar2 = 0;
  do {
    *(undefined4 *)((long)this->board + lVar2) = 99;
    lVar2 = lVar2 + 4;
  } while (lVar2 != 0x1e0);
  lVar2 = 0;
  do {
    this->board[*(int *)((long)SQ120 + lVar2)] = 0;
    lVar2 = lVar2 + 4;
  } while (lVar2 != 0x100);
  this->pawns[0] = 0;
  this->pawns[1] = 0;
  this->pawns[2] = 0;
  lVar2 = 0;
  memset(this->pList,0,0x208);
  do {
    this->pNum[lVar2] = 0;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0xd);
  this->material[0] = 0;
  this->material[1] = 0;
  this->side = 2;
  this->ply = 0;
  this->fiftyMove = 0;
  this->enPas = 99;
  this->castlePerm = 0;
  this->hashKey = 0;
  pUVar1 = (this->history).super__Vector_base<board::Undo,_std::allocator<board::Undo>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->history).super__Vector_base<board::Undo,_std::allocator<board::Undo>_>._M_impl.
      super__Vector_impl_data._M_finish != pUVar1) {
    (this->history).super__Vector_base<board::Undo,_std::allocator<board::Undo>_>._M_impl.
    super__Vector_impl_data._M_finish = pUVar1;
  }
  memset(this->searchHistory,0,0x1a60);
  return;
}

Assistant:

void board::Board::reset()
{
    std::fill(std::begin(board), std::end(board), NO_SQ);
    for (int i : SQ120) {
        board[i] = EMPTY;
    }
    std::fill(std::begin(pawns), std::end(pawns), 0ULL);
    for (int i = 0; i < 13; i++) {
        pNum[i] = 0;
        for (int j = 0; j < 10; j++) {
            pList[i][j] = 0;
        }
    }
    material[WHITE] = 0;
    material[BLACK] = 0;
    side = BOTH;
    ply = 0;
    fiftyMove = 0;
    enPas = NO_SQ;
    castlePerm = 0;
    hashKey = 0ULL;
    history.clear();
    clearSearchKillers();
    clearSearchHistory();
}